

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

Matrix44 * __thiscall jpgd::DCT_Upsample::Matrix44::operator-=(Matrix44 *this,Matrix44 *a)

{
  int *piVar1;
  long lVar2;
  
  for (lVar2 = 0xc; lVar2 != 0x4c; lVar2 = lVar2 + 0x10) {
    piVar1 = (int *)((long)(this->v + -1) + 4 + lVar2);
    *piVar1 = *piVar1 - *(int *)((long)(a->v + -1) + 4 + lVar2);
    piVar1 = (int *)((long)(this->v + -1) + 8 + lVar2);
    *piVar1 = *piVar1 - *(int *)((long)(a->v + -1) + 8 + lVar2);
    piVar1 = (int *)((long)(this->v + -1) + 0xc + lVar2);
    *piVar1 = *piVar1 - *(int *)((long)(a->v + -1) + 0xc + lVar2);
    piVar1 = (int *)((long)this->v[0] + lVar2);
    *piVar1 = *piVar1 - *(int *)((long)a->v[0] + lVar2);
  }
  return this;
}

Assistant:

inline Matrix44& operator -= (const Matrix44& a)
    {
      for (int r = 0; r < NUM_ROWS; r++)
      {
        at(r, 0) -= a.at(r, 0);
        at(r, 1) -= a.at(r, 1);
        at(r, 2) -= a.at(r, 2);
        at(r, 3) -= a.at(r, 3);
      }
      return *this;
    }